

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamepad.c
# Opt level: O3

int __thiscall calibrate_button(VCONTROLLER *this,int i)

{
  long lVar1;
  
  if (((byte)key_array[0x3b] & 1) == 0) {
    lVar1 = 1;
    do {
      if ((*(byte *)(key_array + lVar1) & 2) != 0) {
        *(int *)((long)this->private_data + (long)i * 4) = (int)lVar1;
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xe3);
  }
  return 0;
}

Assistant:

static int calibrate_button(VCONTROLLER * this, int i)
{
   (void)this;
   (void)i;
// FIXME
#if 0
   int stickc, axisc, joyc, buttonc;

   poll_joystick();
   joyc = al_get_num_joysticks();
   while (joyc--) {
      /* check axes */
      stickc = joy[joyc].num_sticks;
      while (stickc--) {
         axisc = joy[joyc].stick[stickc].num_axis;
         while (axisc--) {
            if (joy[joyc].stick[stickc].axis[axisc].d1) {
               ((int *)(this->private_data))[i] =
                  4 | 2 | (joyc << 8) | (stickc << 16) | (axisc << 24);
               return 1;
            }

            if (joy[joyc].stick[stickc].axis[axisc].d2) {
               ((int *)(this->private_data))[i] =
                  4 | (joyc << 8) | (stickc << 16) | (axisc << 24);
               return 1;
            }
         }
      }

      /* check buttons */
      buttonc = joy[joyc].num_buttons;
      while (buttonc--) {
         if (joy[joyc].button[buttonc].b) {
            ((int *)(this->private_data))[i] =
               4 | 1 | (joyc << 8) | (buttonc << 16);
            return 1;
         }
      }
   }
#endif
   return 0;
}